

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O1

void map_suite::test_string_bool_one(void)

{
  mapped_type *pmVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  value;
  char input [15];
  iarchive in;
  undefined4 local_1e4;
  key_type local_1e0;
  undefined1 local_1c0 [8];
  _Rb_tree_node_base local_1b8;
  pointer local_198;
  char local_190 [16];
  undefined **local_180 [43];
  pointer local_28;
  pointer local_18;
  
  builtin_strncpy(local_190,"{\"alpha\":true}",0xf);
  local_1c0 = (undefined1  [8])strlen(local_190);
  local_1b8._0_8_ = local_190;
  trial::protocol::json::basic_iarchive<char>::basic_iarchive
            ((basic_iarchive<char> *)local_180,(view_type *)local_1c0);
  local_1b8._M_left = &local_1b8;
  local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
  local_1b8._M_parent = (_Base_ptr)0x0;
  local_198 = (pointer)0x0;
  local_1b8._M_right = local_1b8._M_left;
  trial::protocol::serialization::
  load_overloader<trial::protocol::json::basic_iarchive<char>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_void>
  ::load((basic_iarchive<char> *)local_180,
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)local_1c0,0);
  local_1e0._M_dataplus._M_p = local_198;
  local_1e4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_int>
            ("value.size()","1U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x260,"void map_suite::test_string_bool_one()",&local_1e0,&local_1e4);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"alpha","");
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         *)local_1c0,&local_1e0);
  local_1e4 = CONCAT31(local_1e4._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("value[\"alpha\"]","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x261,"void map_suite::test_string_bool_one()",pmVar1,&local_1e4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)local_1c0);
  local_180[0] = &PTR_vload_001385c8;
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28,(long)local_18 - (long)local_28);
  }
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_180);
  return;
}

Assistant:

void test_string_bool_one()
{
    const char input[] = "{\"alpha\":true}";
    json::iarchive in(input);
    std::map<std::string, bool> value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.size(), 1U);
    TRIAL_PROTOCOL_TEST_EQUAL(value["alpha"], true);
}